

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EditorInterface.cpp
# Opt level: O0

shared_ptr<gui::DialogBox> __thiscall EditorInterface::createSaveDialog(EditorInterface *this)

{
  element_type *peVar1;
  element_type *widget;
  type index;
  element_type *peVar2;
  element_type *locale;
  element_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *in_RDI;
  shared_ptr<gui::DialogBox> sVar4;
  shared_ptr<gui::Button> saveCancelButton;
  shared_ptr<gui::Button> saveRefuseButton;
  shared_ptr<gui::Button> saveSubmitButton;
  shared_ptr<gui::Label> saveLabel;
  shared_ptr<gui::Label> saveTitle;
  element_type *saveDialogPtr;
  shared_ptr<gui::DialogBox> *saveDialog;
  float in_stack_fffffffffffffbd8;
  float in_stack_fffffffffffffbdc;
  Button *in_stack_fffffffffffffbe0;
  anon_class_16_2_4174bb76 *in_stack_fffffffffffffbe8;
  locale *in_stack_fffffffffffffc20;
  char *in_stack_fffffffffffffc28;
  locale *this_01;
  DialogBox *in_stack_fffffffffffffc30;
  DialogBox *this_02;
  shared_ptr<gui::Label> *in_stack_fffffffffffffc38;
  DialogBox *in_stack_fffffffffffffc40;
  Theme *in_stack_fffffffffffffc48;
  Theme *theme;
  locale *this_03;
  shared_ptr<gui::DialogBox> *in_stack_fffffffffffffcb0;
  EditorInterface *in_stack_fffffffffffffcb8;
  EditorInterface *this_04;
  locale local_2e0 [40];
  locale local_2b8 [88];
  locale local_260 [40];
  undefined1 local_238 [88];
  locale local_1e0 [40];
  locale local_1b8 [72];
  undefined1 local_170 [16];
  locale local_160 [40];
  locale local_138 [88];
  undefined1 local_e0 [112];
  _Alloc_hider local_70;
  Vector2<float> local_64 [2];
  locale local_50 [63];
  byte local_11;
  
  local_11 = 0;
  std::unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_>::operator*
            ((unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_> *)in_stack_fffffffffffffbe0);
  std::locale::locale(local_50);
  sf::String::String((String *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                     in_stack_fffffffffffffc20);
  ::gui::DialogBox::create(in_stack_fffffffffffffc48,(String *)in_stack_fffffffffffffc40);
  debugWidgetCreation<gui::DialogBox>(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  std::shared_ptr<gui::DialogBox>::~shared_ptr((shared_ptr<gui::DialogBox> *)0x1ab391);
  sf::String::~String((String *)0x1ab39e);
  std::locale::~locale(local_50);
  std::__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1ab3b8);
  sf::Vector2<float>::Vector2(local_64,300.0,100.0);
  ::gui::DialogBox::setSize
            ((DialogBox *)in_stack_fffffffffffffbe0,
             (Vector2f *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  peVar1 = std::__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ab403);
  (*(peVar1->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase[3])(peVar1,0);
  local_70._M_p =
       (pointer)std::__shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2> *)in_RDI);
  std::unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_>::operator*
            ((unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_> *)in_stack_fffffffffffffbe0);
  std::locale::locale((locale *)(local_e0 + 0x28));
  sf::String::String((String *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                     in_stack_fffffffffffffc20);
  ::gui::Label::create(in_stack_fffffffffffffc48,(String *)in_stack_fffffffffffffc40);
  debugWidgetCreation<gui::Label>
            (in_stack_fffffffffffffcb8,(shared_ptr<gui::Label> *)in_stack_fffffffffffffcb0);
  std::shared_ptr<gui::Label>::~shared_ptr((shared_ptr<gui::Label> *)0x1ab4c1);
  sf::String::~String((String *)0x1ab4ce);
  std::locale::~locale((locale *)(local_e0 + 0x28));
  widget = std::__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1ab4e8);
  this_04 = (EditorInterface *)local_e0;
  std::locale::locale((locale *)this_04);
  sf::String::String((String *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                     in_stack_fffffffffffffc20);
  ::gui::Label::setLabel
            ((Label *)in_stack_fffffffffffffbe0,
             (String *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  sf::String::~String((String *)0x1ab547);
  std::locale::~locale((locale *)local_e0);
  peVar1 = std::__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ab561);
  std::shared_ptr<gui::Label>::shared_ptr
            ((shared_ptr<gui::Label> *)in_stack_fffffffffffffbe0,
             (shared_ptr<gui::Label> *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
            );
  ::gui::DialogBox::setTitle(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  std::shared_ptr<gui::Label>::~shared_ptr((shared_ptr<gui::Label> *)0x1ab5aa);
  index = std::unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_>::operator*
                    ((unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_> *)
                     in_stack_fffffffffffffbe0);
  this_03 = local_138;
  std::locale::locale(this_03);
  sf::String::String((String *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                     in_stack_fffffffffffffc20);
  ::gui::Label::create(in_stack_fffffffffffffc48,(String *)in_stack_fffffffffffffc40);
  debugWidgetCreation<gui::Label>(this_04,(shared_ptr<gui::Label> *)widget);
  std::shared_ptr<gui::Label>::~shared_ptr((shared_ptr<gui::Label> *)0x1ab643);
  sf::String::~String((String *)0x1ab650);
  std::locale::~locale(local_138);
  std::__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1ab66a);
  std::locale::locale(local_160);
  sf::String::String((String *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                     in_stack_fffffffffffffc20);
  ::gui::Label::setLabel
            ((Label *)in_stack_fffffffffffffbe0,
             (String *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  sf::String::~String((String *)0x1ab6c9);
  std::locale::~locale(local_160);
  std::__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1ab6e3);
  ::gui::Widget::setPosition
            (&in_stack_fffffffffffffbe0->super_Widget,in_stack_fffffffffffffbdc,
             in_stack_fffffffffffffbd8);
  peVar2 = std::__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ab70a);
  std::shared_ptr<gui::Widget>::shared_ptr<gui::Label,void>
            ((shared_ptr<gui::Widget> *)in_stack_fffffffffffffbe0,
             (shared_ptr<gui::Label> *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
            );
  (*(peVar2->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase[2])
            (peVar2,local_170);
  std::shared_ptr<gui::Widget>::~shared_ptr((shared_ptr<gui::Widget> *)0x1ab757);
  std::unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_>::operator*
            ((unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_> *)in_stack_fffffffffffffbe0);
  std::locale::locale(local_1b8);
  sf::String::String((String *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                     in_stack_fffffffffffffc20);
  ::gui::Button::create(in_stack_fffffffffffffc48,(String *)in_stack_fffffffffffffc40);
  debugWidgetCreation<gui::Button>(this_04,(shared_ptr<gui::Button> *)widget);
  std::shared_ptr<gui::Button>::~shared_ptr((shared_ptr<gui::Button> *)0x1ab7f0);
  sf::String::~String((String *)0x1ab7fd);
  std::locale::~locale(local_1b8);
  std::__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1ab817)
  ;
  std::locale::locale(local_1e0);
  sf::String::String((String *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                     in_stack_fffffffffffffc20);
  ::gui::Button::setLabel
            (in_stack_fffffffffffffbe0,
             (String *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  sf::String::~String((String *)0x1ab870);
  std::locale::~locale(local_1e0);
  peVar2 = std::__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ab88a);
  theme = (Theme *)(local_238 + 0x48);
  std::shared_ptr<gui::Button>::shared_ptr
            ((shared_ptr<gui::Button> *)in_stack_fffffffffffffbe0,
             (shared_ptr<gui::Button> *)
             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  ::gui::DialogBox::setSubmitButton
            (in_stack_fffffffffffffc30,(size_t)in_stack_fffffffffffffc28,
             (shared_ptr<gui::Button> *)in_stack_fffffffffffffc20);
  std::shared_ptr<gui::Button>::~shared_ptr((shared_ptr<gui::Button> *)0x1ab8cb);
  std::unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_>::operator*
            ((unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_> *)in_stack_fffffffffffffbe0);
  this_02 = (DialogBox *)local_238;
  std::locale::locale((locale *)this_02);
  sf::String::String((String *)this_02,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  ::gui::Button::create(theme,(String *)peVar2);
  debugWidgetCreation<gui::Button>(this_04,(shared_ptr<gui::Button> *)widget);
  std::shared_ptr<gui::Button>::~shared_ptr((shared_ptr<gui::Button> *)0x1ab958);
  sf::String::~String((String *)0x1ab965);
  std::locale::~locale((locale *)local_238);
  locale = std::__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1ab97f);
  this_01 = local_260;
  std::locale::locale(this_01);
  sf::String::String((String *)this_02,(char *)this_01,(locale *)locale);
  ::gui::Button::setLabel
            (in_stack_fffffffffffffbe0,
             (String *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  sf::String::~String((String *)0x1ab9d2);
  std::locale::~locale(local_260);
  std::__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1ab9ec);
  std::shared_ptr<gui::Button>::shared_ptr
            ((shared_ptr<gui::Button> *)in_stack_fffffffffffffbe0,
             (shared_ptr<gui::Button> *)
             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  ::gui::DialogBox::setOptionButton(peVar1,(size_t)index,(shared_ptr<gui::Button> *)this_03);
  std::shared_ptr<gui::Button>::~shared_ptr((shared_ptr<gui::Button> *)0x1aba2e);
  std::unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_>::operator*
            ((unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_> *)in_stack_fffffffffffffbe0);
  std::locale::locale(local_2b8);
  sf::String::String((String *)this_02,(char *)this_01,(locale *)locale);
  ::gui::Button::create(theme,(String *)peVar2);
  debugWidgetCreation<gui::Button>(this_04,(shared_ptr<gui::Button> *)widget);
  std::shared_ptr<gui::Button>::~shared_ptr((shared_ptr<gui::Button> *)0x1ababb);
  sf::String::~String((String *)0x1abac8);
  std::locale::~locale(local_2b8);
  this_00 = std::__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )0x1abae2);
  std::locale::locale(local_2e0);
  sf::String::String((String *)this_02,(char *)this_01,(locale *)locale);
  ::gui::Button::setLabel
            (in_stack_fffffffffffffbe0,
             (String *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  sf::String::~String((String *)0x1abb35);
  std::locale::~locale(local_2e0);
  std::__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1abb4f)
  ;
  ::gui::Signal<gui::Widget*,sf::Vector2<float>const&>::
  connect<EditorInterface::createSaveDialog()const::__0>
            ((Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *)this_00,in_stack_fffffffffffffbe8)
  ;
  peVar1 = std::__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1abb95);
  std::shared_ptr<gui::Button>::shared_ptr
            ((shared_ptr<gui::Button> *)peVar1,
             (shared_ptr<gui::Button> *)
             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  ::gui::DialogBox::setCancelButton(this_02,(size_t)this_01,(shared_ptr<gui::Button> *)locale);
  std::shared_ptr<gui::Button>::~shared_ptr((shared_ptr<gui::Button> *)0x1abbd7);
  local_11 = 1;
  std::shared_ptr<gui::Button>::~shared_ptr((shared_ptr<gui::Button> *)0x1abbec);
  std::shared_ptr<gui::Button>::~shared_ptr((shared_ptr<gui::Button> *)0x1abbf9);
  std::shared_ptr<gui::Button>::~shared_ptr((shared_ptr<gui::Button> *)0x1abc06);
  std::shared_ptr<gui::Label>::~shared_ptr((shared_ptr<gui::Label> *)0x1abc13);
  std::shared_ptr<gui::Label>::~shared_ptr((shared_ptr<gui::Label> *)0x1abc20);
  _Var3._M_pi = extraout_RDX;
  if ((local_11 & 1) == 0) {
    std::shared_ptr<gui::DialogBox>::~shared_ptr((shared_ptr<gui::DialogBox> *)0x1ac1c1);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<gui::DialogBox>)
         sVar4.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<gui::DialogBox> EditorInterface::createSaveDialog() const {
    auto saveDialog = debugWidgetCreation(gui::DialogBox::create(*theme_, "saveDialog"));
    saveDialog->setSize({300.0f, 100.0f});
    saveDialog->setVisible(false);
    auto saveDialogPtr = saveDialog.get();

    auto saveTitle = debugWidgetCreation(gui::Label::create(*theme_, "saveTitle"));
    saveTitle->setLabel("Save Changes?");
    saveDialog->setTitle(saveTitle);

    auto saveLabel = debugWidgetCreation(gui::Label::create(*theme_, "saveLabel"));
    saveLabel->setLabel("Board has been modified.");
    saveLabel->setPosition(10.0f, 30.0f);
    saveDialog->addChild(saveLabel);

    auto saveSubmitButton = debugWidgetCreation(gui::Button::create(*theme_, "saveSubmitButton"));
    saveSubmitButton->setLabel("Save");
    saveDialog->setSubmitButton(0, saveSubmitButton);

    auto saveRefuseButton = debugWidgetCreation(gui::Button::create(*theme_, "saveRefuseButton"));
    saveRefuseButton->setLabel("Don\'t Save");
    saveDialog->setOptionButton(1, saveRefuseButton);

    auto saveCancelButton = debugWidgetCreation(gui::Button::create(*theme_, "saveCancelButton"));
    saveCancelButton->setLabel("Cancel");
    saveCancelButton->onClick.connect([this,saveDialogPtr]() {
        saveDialogPtr->setVisible(false);
        modalBackground_->setVisible(false);
    });
    saveDialog->setCancelButton(2, saveCancelButton);

    return saveDialog;
}